

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

void __thiscall Log::LOG(Log *this,Address *addr,char *str,...)

{
  FILE *pFVar1;
  char in_AL;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_138 [24];
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  int local_7c;
  int local_78;
  int i;
  int len;
  allocator local_61;
  string local_60 [8];
  string magic;
  uint local_3c;
  undefined4 local_38;
  int magicNumber;
  va_list vararglist;
  char *str_local;
  Address *addr_local;
  Log *this_local;
  
  if (in_AL != '\0') {
    local_108 = in_XMM0_Qa;
    local_f8 = in_XMM1_Qa;
    local_e8 = in_XMM2_Qa;
    local_d8 = in_XMM3_Qa;
    local_c8 = in_XMM4_Qa;
    local_b8 = in_XMM5_Qa;
    local_a8 = in_XMM6_Qa;
    local_98 = in_XMM7_Qa;
  }
  local_120 = in_RCX;
  local_118 = in_R8;
  local_110 = in_R9;
  vararglist[0].reg_save_area = str;
  if (LOG::dbg_opened == 0x27f) {
    sprintf(LOG::stdstring,"%d.%d.%d.%d:%d ",(ulong)(uint)(int)addr->addr[0],
            (ulong)(uint)(int)addr->addr[1],(ulong)(uint)(int)addr->addr[2],
            (ulong)(uint)(int)addr->addr[3],(int)*(short *)(addr->addr + 4));
  }
  else {
    LOG::numwrites = 0;
    LOG::stdstring2[0] = '\0';
    strcpy(LOG::stdstring3,LOG::stdstring2);
    strcat(LOG::stdstring2,"dbg.log");
    strcat(LOG::stdstring3,"stats.log");
    LOG::fp = (FILE *)fopen(LOG::stdstring2,"w");
    LOG::fp2 = (FILE *)fopen(LOG::stdstring3,"w");
    LOG::dbg_opened = 0x27f;
  }
  vararglist[0].overflow_arg_area = local_138;
  vararglist[0]._0_8_ = &stack0x00000008;
  magicNumber = 0x30;
  local_38 = 0x18;
  vsprintf(LOG::buffer,(char *)vararglist[0].reg_save_area,&local_38);
  if ((this->firstTime & 1U) == 0) {
    local_3c = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"CS425",&local_61);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    local_78 = std::__cxx11::string::length();
    for (local_7c = 0; local_7c < local_78; local_7c = local_7c + 1) {
      pcVar4 = (char *)std::__cxx11::string::at((ulong)local_60);
      local_3c = (int)*pcVar4 + local_3c;
    }
    fprintf((FILE *)LOG::fp,"%x\n",(ulong)local_3c);
    this->firstTime = true;
    std::__cxx11::string::~string(local_60);
  }
  iVar2 = memcmp(LOG::buffer,"#STATSLOG#",10);
  if (iVar2 == 0) {
    fprintf((FILE *)LOG::fp2,"\n %s",LOG::stdstring);
    pFVar1 = LOG::fp2;
    uVar3 = Params::getcurrtime(this->par);
    fprintf((FILE *)pFVar1,"[%d] ",(ulong)uVar3);
    fprintf((FILE *)LOG::fp2,LOG::buffer);
  }
  else {
    fprintf((FILE *)LOG::fp,"\n %s",LOG::stdstring);
    pFVar1 = LOG::fp;
    uVar3 = Params::getcurrtime(this->par);
    fprintf((FILE *)pFVar1,"[%d] ",(ulong)uVar3);
    fprintf((FILE *)LOG::fp,LOG::buffer);
  }
  LOG::numwrites = LOG::numwrites + 1;
  if (0 < LOG::numwrites) {
    fflush((FILE *)LOG::fp);
    fflush((FILE *)LOG::fp2);
    LOG::numwrites = 0;
  }
  return;
}

Assistant:

void Log::LOG(Address *addr, const char * str, ...) {

	static FILE *fp;
	static FILE *fp2;
	va_list vararglist;
	static char buffer[30000];
	static int numwrites;
	static char stdstring[30];
	static char stdstring2[40];
	static char stdstring3[40]; 
	static int dbg_opened=0;

	if(dbg_opened != 639){
		numwrites=0;

		stdstring2[0]=0;

		strcpy(stdstring3, stdstring2);

		strcat(stdstring2, DBG_LOG);
		strcat(stdstring3, STATS_LOG);

		fp = fopen(stdstring2, "w");
		fp2 = fopen(stdstring3, "w");

		dbg_opened=639;
	}
	else 

	sprintf(stdstring, "%d.%d.%d.%d:%d ", addr->addr[0], addr->addr[1], addr->addr[2], addr->addr[3], *(short *)&addr->addr[4]);

	va_start(vararglist, str);
	vsprintf(buffer, str, vararglist);
	va_end(vararglist);

	if (!firstTime) {
		int magicNumber = 0;
		string magic = MAGIC_NUMBER;
		int len = magic.length();
		for ( int i = 0; i < len; i++ ) {
			magicNumber += (int)magic.at(i);
		}
		fprintf(fp, "%x\n", magicNumber);
		firstTime = true;
	}

	if(memcmp(buffer, "#STATSLOG#", 10)==0){
		fprintf(fp2, "\n %s", stdstring);
		fprintf(fp2, "[%d] ", par->getcurrtime());

		fprintf(fp2, buffer);
	}
	else{
		fprintf(fp, "\n %s", stdstring);
		fprintf(fp, "[%d] ", par->getcurrtime());
		fprintf(fp, buffer);

	}

	if(++numwrites >= MAXWRITES){
		fflush(fp);
		fflush(fp2);
		numwrites=0;
	}

}